

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

void fe_dct2(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep,int htk)

{
  byte bVar1;
  uint uVar2;
  melfb_t *pmVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float fVar7;
  
  fVar7 = (float)(double)*mflogspec;
  *mfcep = (mfcc_t)fVar7;
  pmVar3 = fe->mel_fb;
  uVar2 = pmVar3->num_filters;
  for (lVar5 = 1; lVar5 < (int)uVar2; lVar5 = lVar5 + 1) {
    fVar7 = (float)((double)fVar7 + (double)mflogspec[lVar5]);
    *mfcep = (mfcc_t)fVar7;
  }
  *mfcep = (mfcc_t)(fVar7 * (float)(&pmVar3->sqrt_inv_n)[htk != 0]);
  bVar1 = fe->num_cepstra;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  for (uVar4 = 1; uVar4 < bVar1; uVar4 = uVar4 + 1) {
    mfcep[uVar4] = 0.0;
    fVar7 = 0.0;
    for (uVar6 = 0; uVar2 != uVar6; uVar6 = uVar6 + 1) {
      fVar7 = (float)((double)(float)pmVar3->mel_cosine[uVar4][uVar6] * (double)mflogspec[uVar6] +
                     (double)fVar7);
      mfcep[uVar4] = (mfcc_t)fVar7;
    }
    mfcep[uVar4] = (mfcc_t)(fVar7 * (float)pmVar3->sqrt_inv_2n);
  }
  return;
}

Assistant:

void
fe_dct2(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep, int htk)
{
    int32 i, j;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0];
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];
    if (htk)
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_2n);
    else                        /* sqrt(1/N) = sqrt(2/N) * 1/sqrt(2) */
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_n);

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            mfcep[i] += COSMUL(mflogspec[j], fe->mel_fb->mel_cosine[i][j]);
        }
        mfcep[i] = COSMUL(mfcep[i], fe->mel_fb->sqrt_inv_2n);
    }
}